

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV2CameraSettingsBlock(Parser *this,Camera *camera)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ai_real *fOut;
  undefined1 *puVar7;
  int local_44;
  
  puVar7 = &(camera->super_BaseNode).field_0x154;
  local_44 = 0;
  do {
    while (pcVar2 = this->filePtr, *pcVar2 != '*') {
LAB_00412af3:
      pbVar3 = (byte *)this->filePtr;
      bVar1 = *pbVar3;
      uVar5 = (uint)bVar1;
      if (bVar1 == 0x7b) {
        local_44 = local_44 + 1;
      }
      else if (bVar1 == 0x7d) {
        local_44 = local_44 + -1;
        if (local_44 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (uVar5 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a CAMERA_SETTINGS chunk (Level 2)");
      }
      if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) &&
         (this->bLastWasEndLine == false)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = (char *)(pbVar3 + 1);
    }
    this->filePtr = pcVar2 + 1;
    iVar4 = strncmp("CAMERA_NEAR",pcVar2 + 1,0xb);
    if (iVar4 != 0) {
LAB_00412a46:
      pcVar2 = this->filePtr;
      iVar4 = strncmp("CAMERA_FAR",pcVar2,10);
      if (iVar4 == 0) {
        bVar1 = pcVar2[10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar6 = pcVar2 + 0xb;
          fOut = &camera->mFar;
          if (bVar1 == 0) {
            pcVar6 = pcVar2 + 10;
          }
          goto LAB_00412ae3;
        }
      }
      pcVar2 = this->filePtr;
      iVar4 = strncmp("CAMERA_FOV",pcVar2,10);
      if (iVar4 == 0) {
        bVar1 = pcVar2[10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar6 = pcVar2 + 0xb;
          fOut = (ai_real *)puVar7;
          if (bVar1 == 0) {
            pcVar6 = pcVar2 + 10;
          }
          goto LAB_00412ae3;
        }
      }
      goto LAB_00412af3;
    }
    bVar1 = pcVar2[0xc];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00412a46;
    pcVar6 = pcVar2 + 0xd;
    fOut = &camera->mNear;
    if (bVar1 == 0) {
      pcVar6 = pcVar2 + 0xc;
    }
LAB_00412ae3:
    this->filePtr = pcVar6;
    ParseLV4MeshFloat(this,fOut);
  } while( true );
}

Assistant:

void Parser::ParseLV2CameraSettingsBlock(ASE::Camera& camera)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"CAMERA_NEAR" ,11))
            {
                ParseLV4MeshFloat(camera.mNear);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FAR" ,10))
            {
                ParseLV4MeshFloat(camera.mFar);
                continue;
            }
            if (TokenMatch(filePtr,"CAMERA_FOV" ,10))
            {
                ParseLV4MeshFloat(camera.mFOV);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","CAMERA_SETTINGS");
    }
    return;
}